

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<kj::ArrayPtr<const_char>_>::setCapacity
          (Vector<kj::ArrayPtr<const_char>_> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<kj::ArrayPtr<const_char>_> *pAVar2;
  size_t __length;
  size_t extraout_RDX;
  size_t size;
  undefined1 local_38 [8];
  ArrayBuilder<kj::ArrayPtr<const_char>_> newBuilder;
  size_t newSize_local;
  Vector<kj::ArrayPtr<const_char>_> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<kj::ArrayPtr<const_char>_>::size(&this->builder);
  size = __length;
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<kj::ArrayPtr<const_char>_>::truncate
              (&this->builder,(char *)newBuilder.disposer,__length);
    size = extraout_RDX;
  }
  heapArrayBuilder<kj::ArrayPtr<char_const>>
            ((ArrayBuilder<kj::ArrayPtr<const_char>_> *)local_38,(kj *)newBuilder.disposer,size);
  pAVar2 = mv<kj::ArrayBuilder<kj::ArrayPtr<char_const>>>(&this->builder);
  ArrayBuilder<kj::ArrayPtr<char_const>>::addAll<kj::ArrayBuilder<kj::ArrayPtr<char_const>>>
            ((ArrayBuilder<kj::ArrayPtr<char_const>> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<kj::ArrayPtr<char_const>>>
                     ((ArrayBuilder<kj::ArrayPtr<const_char>_> *)local_38);
  ArrayBuilder<kj::ArrayPtr<const_char>_>::operator=(&this->builder,pAVar2);
  ArrayBuilder<kj::ArrayPtr<const_char>_>::~ArrayBuilder
            ((ArrayBuilder<kj::ArrayPtr<const_char>_> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }